

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandLineArgument.h
# Opt level: O0

string * __thiscall
cmCommandLineArgument<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*,_cmMakefile_*)>
::extract_single_value
          (string *__return_storage_ptr__,
          cmCommandLineArgument<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*,_cmMakefile_*)>
          *this,string *input,ParseMode *parseState)

{
  bool bVar1;
  size_type __pos;
  const_reference pvVar2;
  allocator<char> local_49;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  undefined1 local_38 [8];
  basic_string_view<char,_std::char_traits<char>_> possible_value;
  ParseMode *parseState_local;
  string *input_local;
  cmCommandLineArgument<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*,_cmMakefile_*)>
  *this_local;
  
  possible_value._M_str = (char *)parseState;
  local_48 = (basic_string_view<char,_std::char_traits<char>_>)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)input);
  __pos = std::__cxx11::string::size();
  _local_38 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                        (&local_48,__pos,0xffffffffffffffff);
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_38);
  if (bVar1) {
    possible_value._M_str[0] = '\x03';
    possible_value._M_str[1] = '\0';
    possible_value._M_str[2] = '\0';
    possible_value._M_str[3] = '\0';
  }
  else {
    pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                       ((basic_string_view<char,_std::char_traits<char>_> *)local_38,0);
    if (*pvVar2 == '=') {
      std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                ((basic_string_view<char,_std::char_traits<char>_> *)local_38,1);
      bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                        ((basic_string_view<char,_std::char_traits<char>_> *)local_38);
      if (bVar1) {
        possible_value._M_str[0] = '\x03';
        possible_value._M_str[1] = '\0';
        possible_value._M_str[2] = '\0';
        possible_value._M_str[3] = '\0';
      }
    }
  }
  if (*(int *)possible_value._M_str == 0) {
    pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                       ((basic_string_view<char,_std::char_traits<char>_> *)local_38,0);
    if (*pvVar2 == ' ') {
      std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                ((basic_string_view<char,_std::char_traits<char>_> *)local_38,1);
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)__return_storage_ptr__,
             (basic_string_view<char,_std::char_traits<char>_> *)local_38,&local_49);
  std::allocator<char>::~allocator(&local_49);
  return __return_storage_ptr__;
}

Assistant:

std::string extract_single_value(std::string const& input,
                                   ParseMode& parseState) const
  {
    // parse the string to get the value
    auto possible_value = cm::string_view(input).substr(this->Name.size());
    if (possible_value.empty()) {
      parseState = ParseMode::ValueError;
    } else if (possible_value[0] == '=') {
      possible_value.remove_prefix(1);
      if (possible_value.empty()) {
        parseState = ParseMode::ValueError;
      }
    }
    if (parseState == ParseMode::Valid && possible_value[0] == ' ') {
      possible_value.remove_prefix(1);
    }
    return std::string(possible_value);
  }